

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::scroll(QWidget *this,int dx,int dy,QRect *r)

{
  bool bVar1;
  QObjectList *this_00;
  qsizetype qVar2;
  QWidgetPrivate *pQVar3;
  QGraphicsProxyWidget *pQVar4;
  ulong uVar5;
  QWidget *in_RCX;
  int in_EDX;
  int in_ESI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QRectF *this_01;
  QRectF *this_02;
  QRect *rect;
  const_iterator __end3;
  const_iterator __begin3;
  QRegion *__range3;
  QGraphicsProxyWidget *proxy;
  QWidgetPrivate *d;
  QWidget *in_stack_fffffffffffffee8;
  QWidgetPrivate *in_stack_fffffffffffffef0;
  QRect *in_stack_fffffffffffffef8;
  QRectF *in_stack_ffffffffffffff00;
  QRectF *in_stack_ffffffffffffff08;
  QRect *in_stack_ffffffffffffff20;
  QRect *in_stack_ffffffffffffff28;
  QGraphicsItem *dy_00;
  qreal in_stack_ffffffffffffff60;
  QGraphicsItem *in_stack_ffffffffffffff68;
  QRegion local_18;
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dy_00 = in_RDI;
  bVar1 = updatesEnabled((QWidget *)0x37f53d);
  if (!bVar1) {
    this_00 = QObject::children((QObject *)0x37f54b);
    qVar2 = QList<QObject_*>::size(this_00);
    if (qVar2 == 0) goto LAB_0037f79d;
  }
  bVar1 = isVisible((QWidget *)0x37f563);
  if ((bVar1) && ((in_ESI != 0 || (in_EDX != 0)))) {
    pQVar3 = d_func((QWidget *)0x37f589);
    pQVar4 = QWidgetPrivate::nearestGraphicsProxyWidget(in_stack_fffffffffffffee8);
    if (pQVar4 == (QGraphicsProxyWidget *)0x0) {
      QWidgetPrivate::scroll_sys
                (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (int)in_stack_fffffffffffffee8,(QRect *)0x37f79d);
    }
    else {
      uVar5 = QRegion::isEmpty();
      if ((uVar5 & 1) == 0) {
        QRegion::translated((int)&local_18,(int)pQVar3 + 0xe0);
        QRegion::operator&(&local_10,(QRect *)&local_18);
        QRegion::~QRegion(&local_18);
        in_stack_ffffffffffffff28 = (QRect *)QRegion::begin();
        in_stack_ffffffffffffff20 = (QRect *)QRegion::end();
        for (; in_stack_ffffffffffffff28 != in_stack_ffffffffffffff20;
            in_stack_ffffffffffffff28 = in_stack_ffffffffffffff28 + 1) {
          in_stack_ffffffffffffff08 =
               (QRectF *)&(pQVar4->super_QGraphicsWidget).super_QGraphicsObject.super_QGraphicsItem;
          QRectF::QRectF(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          QGraphicsItem::update(in_RDI,in_stack_ffffffffffffff08);
        }
        QRegion::~QRegion(&local_10);
      }
      this_01 = (QRectF *)(double)in_ESI;
      this_02 = (QRectF *)(double)in_EDX;
      QGraphicsProxyWidget::subWidgetRect((QGraphicsProxyWidget *)in_stack_ffffffffffffff08,in_RCX);
      QRectF::topLeft(this_01);
      QPointF::toPoint((QPointF *)this_02);
      QRect::translated(in_stack_ffffffffffffff28,(QPoint *)in_stack_ffffffffffffff20);
      QRectF::QRectF(this_02,(QRect *)this_01);
      QGraphicsItem::scroll
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,(qreal)dy_00,
                 (QRectF *)CONCAT44(in_ESI,in_EDX));
    }
  }
LAB_0037f79d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::scroll(int dx, int dy, const QRect &r)
{

    if ((!updatesEnabled() && children().size() == 0) || !isVisible())
        return;
    if (dx == 0 && dy == 0)
        return;
    Q_D(QWidget);
#if QT_CONFIG(graphicsview)
    if (QGraphicsProxyWidget *proxy = QWidgetPrivate::nearestGraphicsProxyWidget(this)) {
        // Graphics View maintains its own dirty region as a list of rects;
        // until we can connect item updates directly to the view, we must
        // separately add a translated dirty region.
        if (!d->dirty.isEmpty()) {
            for (const QRect &rect : d->dirty.translated(dx, dy) & r)
                proxy->update(rect);
        }
        proxy->scroll(dx, dy, r.translated(proxy->subWidgetRect(this).topLeft().toPoint()));
        return;
    }
#endif
    d->scroll_sys(dx, dy, r);
}